

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5ExprNodeNext_OR(Fts5Expr *pExpr,Fts5ExprNode *pNode,int bFromValid,i64 iFrom)

{
  long lVar1;
  long lVar2;
  int iVar3;
  Fts5ExprNode *in_RCX;
  int in_EDX;
  long in_RSI;
  Fts5Expr *in_RDI;
  int rc;
  Fts5ExprNode *p1;
  i64 iLast;
  int i;
  int local_2c;
  undefined4 in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_RSI + 0x18);
  local_2c = 0;
  while( true ) {
    if (*(int *)(in_RSI + 0x28) <= local_2c) {
      fts5ExprNodeTest_OR((Fts5Expr *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),in_RCX);
      return 0;
    }
    lVar2 = *(long *)(in_RSI + 0x30 + (long)local_2c * 8);
    if ((*(int *)(lVar2 + 4) == 0) &&
       (((*(long *)(lVar2 + 0x18) == lVar1 ||
         ((in_EDX != 0 &&
          (iVar3 = fts5RowidCmp(in_RDI,*(i64 *)(lVar2 + 0x18),(i64)in_RCX), iVar3 < 0)))) &&
        (iVar3 = (**(code **)(lVar2 + 0x10))(in_RDI,lVar2,in_EDX,in_RCX), iVar3 != 0)))) break;
    local_2c = local_2c + 1;
  }
  *(undefined4 *)(in_RSI + 8) = 0;
  return iVar3;
}

Assistant:

static int fts5ExprNodeNext_OR(
  Fts5Expr *pExpr,
  Fts5ExprNode *pNode,
  int bFromValid,
  i64 iFrom
){
  int i;
  i64 iLast = pNode->iRowid;

  for(i=0; i<pNode->nChild; i++){
    Fts5ExprNode *p1 = pNode->apChild[i];
    assert( p1->bEof || fts5RowidCmp(pExpr, p1->iRowid, iLast)>=0 );
    if( p1->bEof==0 ){
      if( (p1->iRowid==iLast)
       || (bFromValid && fts5RowidCmp(pExpr, p1->iRowid, iFrom)<0)
      ){
        int rc = fts5ExprNodeNext(pExpr, p1, bFromValid, iFrom);
        if( rc!=SQLITE_OK ){
          pNode->bNomatch = 0;
          return rc;
        }
      }
    }
  }

  fts5ExprNodeTest_OR(pExpr, pNode);
  return SQLITE_OK;
}